

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::TraverseSchema::traverseAttributeDecl
          (TraverseSchema *this,DOMElement *elem,ComplexTypeInfo *typeInfo,bool topLevel)

{
  SchemaInfo *pSVar1;
  XMLStringPool *pXVar2;
  SchemaGrammar *this_00;
  RefHashTableOf<xercesc_4_0::XMLAttDef,_xercesc_4_0::StringHasher> *this_01;
  bool bVar3;
  unsigned_short uVar4;
  short sVar5;
  int iVar6;
  ValidatorType VVar7;
  uint uVar8;
  XMLCh *src;
  XMLCh *pXVar9;
  XMLCh *defaultVal_00;
  XMLCh *pXVar10;
  XMLCh *type;
  DOMElement *pDVar11;
  undefined4 extraout_var;
  XMLSize_t XVar12;
  SchemaAttDef *pSVar13;
  undefined4 extraout_var_00;
  ValidationContext *pVVar14;
  undefined4 extraout_var_01;
  XSAnnotation *pXVar15;
  undefined4 extraout_var_02;
  bool bVar16;
  bool bVar17;
  XMLCh *local_2e0;
  byte local_2a1;
  XMLCh *local_220;
  XMLCh *local_210;
  XMLCh *local_1f8;
  XMLCh *local_1e8;
  unsigned_short local_178;
  SchemaAttDef *attDef;
  ArrayJanitor<char16_t> tempURIName_1;
  XMLCh *normalizedValue_1;
  XMLException *excep;
  OutOfMemoryException *anon_var_0;
  ArrayJanitor<char16_t> tempURIName;
  XMLCh *normalizedValue;
  short wsFacet;
  XMLCh *pXStack_108;
  bool ofTypeID;
  XMLCh *valueToCheck;
  bool prohibited;
  DatatypeValidator *pDStack_f8;
  bool required;
  DatatypeValidator *dvBack;
  XMLCh *typeURI;
  XMLCh *prefix;
  XMLCh *localPart;
  SchemaInfo *saveInfo;
  DatatypeValidator *pDStack_c8;
  AttTypes attType;
  DatatypeValidator *dv;
  int uriIndex;
  XMLCh *qualified;
  XMLCh *contentName;
  bool badContent;
  Janitor<xercesc_4_0::XSAnnotation> janAnnot;
  DOMElement *simpleType;
  XMLCh *dvType;
  XMLCh *attForm;
  XMLCh *useVal;
  XMLCh *fixedVal;
  XMLCh *defaultVal;
  unsigned_short scope;
  bool refEmpty;
  bool nameEmpty;
  XMLCh *ref;
  XMLCh *name;
  NamespaceScopeManager nsMgr;
  bool topLevel_local;
  ComplexTypeInfo *typeInfo_local;
  DOMElement *elem_local;
  TraverseSchema *this_local;
  
  nsMgr.fSchemaInfo._7_1_ = topLevel;
  NamespaceScopeManager::NamespaceScopeManager
            ((NamespaceScopeManager *)&name,elem,this->fSchemaInfo,this);
  src = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_NAME,NCName);
  pXVar9 = getElementAttValue(this,elem,L"ref",QName);
  bVar16 = true;
  if (src != (XMLCh *)0x0) {
    bVar16 = *src == L'\0';
  }
  bVar17 = true;
  if (pXVar9 != (XMLCh *)0x0) {
    bVar17 = *pXVar9 == L'\0';
  }
  if ((bVar16) && (bVar17)) {
    reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x10);
    goto LAB_0043693a;
  }
  if (((nsMgr.fSchemaInfo._7_1_ & 1) != 0) && (bVar16)) {
    reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0xf);
    goto LAB_0043693a;
  }
  if ((nsMgr.fSchemaInfo._7_1_ & 1) == 0) {
    local_178 = 7;
    if (bVar17) {
      local_178 = 6;
    }
  }
  else {
    local_178 = 5;
  }
  GeneralAttributeCheck::checkAttributes
            (&this->fAttributeCheck,elem,local_178,this,(bool)(nsMgr.fSchemaInfo._7_1_ & 1),
             this->fNonXSAttList);
  defaultVal_00 = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_DEFAULT,UnKnown);
  useVal = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_FIXED,UnKnown);
  attForm = getElementAttValue(this,elem,L"use",UnKnown);
  pXVar10 = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_FORM,UnKnown);
  type = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_TYPE,QName);
  pDVar11 = XUtil::getFirstChildElement(&elem->super_DOMNode);
  janAnnot.fData = (XSAnnotation *)checkContent(this,elem,pDVar11,true,true);
  Janitor<xercesc_4_0::XSAnnotation>::Janitor
            ((Janitor<xercesc_4_0::XSAnnotation> *)&stack0xffffffffffffff60,this->fAnnotation);
  bVar16 = false;
  for (; janAnnot.fData != (XSAnnotation *)0x0;
      janAnnot.fData = (XSAnnotation *)XUtil::getNextSiblingElement(janAnnot.fData)) {
    iVar6 = (*((janAnnot.fData)->super_XSerializable)._vptr_XSerializable[0x18])();
    bVar3 = XMLString::equals((XMLCh *)SchemaSymbols::fgELT_SIMPLETYPE,
                              (XMLCh *)CONCAT44(extraout_var,iVar6));
    if (bVar3) {
      pDVar11 = XUtil::getNextSiblingElement((DOMNode *)janAnnot.fData);
      if (pDVar11 != (DOMElement *)0x0) {
        bVar16 = true;
      }
      break;
    }
    bVar16 = true;
  }
  if (bVar16) {
    local_1e8 = pXVar9;
    if (src != (XMLCh *)0x0) {
      local_1e8 = src;
    }
    reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x4e,local_1e8,(XMLCh *)0x0,
                      (XMLCh *)0x0,(XMLCh *)0x0);
  }
  if (defaultVal_00 != (XMLCh *)0x0) {
    if (useVal != (XMLCh *)0x0) {
      useVal = (XMLCh *)0x0;
      local_1f8 = pXVar9;
      if (src != (XMLCh *)0x0) {
        local_1f8 = src;
      }
      reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x2f,local_1f8,(XMLCh *)0x0,
                        (XMLCh *)0x0,(XMLCh *)0x0);
    }
    if (((attForm != (XMLCh *)0x0) && (*attForm != L'\0')) &&
       (bVar16 = XMLString::equals(attForm,(XMLCh *)SchemaSymbols::fgATTVAL_OPTIONAL), !bVar16)) {
      attForm = (XMLCh *)0x0;
      local_210 = pXVar9;
      if (src != (XMLCh *)0x0) {
        local_210 = src;
      }
      reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x30,local_210,(XMLCh *)0x0,
                        (XMLCh *)0x0,(XMLCh *)0x0);
    }
  }
  if ((bVar17) || ((nsMgr.fSchemaInfo._7_1_ & 1) != 0)) {
    bVar16 = XMLScanner::getGenerateSyntheticAnnotations(this->fScanner);
    if (((bVar16) && (this->fAnnotation == (XSAnnotation *)0x0)) &&
       (XVar12 = ValueVectorOf<xercesc_4_0::DOMNode_*>::size(this->fNonXSAttList), XVar12 != 0)) {
      pXVar15 = generateSyntheticAnnotation(this,elem,this->fNonXSAttList);
      this->fAnnotation = pXVar15;
      Janitor<xercesc_4_0::XSAnnotation>::reset
                ((Janitor<xercesc_4_0::XSAnnotation> *)&stack0xffffffffffffff60,this->fAnnotation);
    }
    XVar12 = XMLString::stringLen(src);
    bVar16 = XMLChar1_0::isValidNCName(src,XVar12);
    if ((!bVar16) || (bVar16 = XMLString::equals(src,(XMLCh *)XMLUni::fgXMLNSString), bVar16)) {
      reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x35,
                        (XMLCh *)SchemaSymbols::fgELT_ATTRIBUTE,src,(XMLCh *)0x0,(XMLCh *)0x0);
    }
    else {
      dv._4_4_ = this->fEmptyNamespaceURI;
      if (((this->fTargetNSURIString != (XMLCh *)0x0) && (*this->fTargetNSURIString != L'\0')) &&
         ((((nsMgr.fSchemaInfo._7_1_ & 1) != 0 ||
           (bVar16 = XMLString::equals(pXVar10,(XMLCh *)SchemaSymbols::fgATTVAL_QUALIFIED), bVar16))
          || ((uVar4 = SchemaInfo::getElemAttrDefaultQualified(this->fSchemaInfo), (uVar4 & 2) != 0
              && ((pXVar10 == (XMLCh *)0x0 || (*pXVar10 == L'\0')))))))) {
        dv._4_4_ = this->fTargetNSURI;
      }
      bVar16 = XMLString::equals(this->fTargetNSURIString,(XMLCh *)SchemaSymbols::fgURI_XSI);
      if (bVar16) {
        reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x95,src,(XMLCh *)0x0,
                          (XMLCh *)0x0,(XMLCh *)0x0);
      }
      else if ((typeInfo == (ComplexTypeInfo *)0x0) ||
              (pSVar13 = ComplexTypeInfo::getAttDef(typeInfo,src,dv._4_4_),
              pSVar13 == (SchemaAttDef *)0x0)) {
        if ((this->fCurrentAttGroupInfo == (XercesAttGroupInfo *)0x0) ||
           (bVar16 = XercesAttGroupInfo::containsAttribute(this->fCurrentAttGroupInfo,src,dv._4_4_),
           !bVar16)) {
          saveInfo._4_4_ = Simple;
          pSVar1 = this->fSchemaInfo;
          if (janAnnot.fData == (XSAnnotation *)0x0) {
            if ((type == (XMLCh *)0x0) || (*type == L'\0')) {
              pDStack_c8 = DatatypeValidatorFactory::getDatatypeValidator
                                     (this->fDatatypeRegistry,
                                      (XMLCh *)SchemaSymbols::fgDT_ANYSIMPLETYPE);
            }
            else {
              checkEnumerationRequiredNotation(this,elem,src,type);
              prefix = getLocalPart(this,type);
              pXVar9 = getPrefix(this,type);
              pXVar9 = resolvePrefixToURI(this,elem,pXVar9);
              bVar16 = XMLString::equals(pXVar9,(XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
              if (bVar16) {
                pDStack_f8 = DatatypeValidatorFactory::getDatatypeValidator
                                       (this->fDatatypeRegistry,prefix);
                pDStack_c8 = pDStack_f8;
              }
              else {
                pDStack_f8 = getAttrDatatypeValidatorNS(this,elem,prefix,pXVar9);
                pDStack_c8 = pDStack_f8;
                while( true ) {
                  local_2a1 = 0;
                  if (pDStack_c8 != (DatatypeValidator *)0x0) {
                    pXVar10 = DatatypeValidator::getTypeUri(pDStack_c8);
                    bVar16 = XMLString::equals(pXVar10,(XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA
                                              );
                    local_2a1 = bVar16 ^ 0xff;
                  }
                  if ((local_2a1 & 1) == 0) break;
                  pDStack_c8 = DatatypeValidator::getBaseValidator(pDStack_c8);
                }
                if (pDStack_c8 != (DatatypeValidator *)0x0) {
                  prefix = DatatypeValidator::getTypeLocalName(pDStack_c8);
                }
              }
              if (pDStack_c8 == (DatatypeValidator *)0x0) {
                saveInfo._4_4_ = Simple;
              }
              else {
                bVar16 = XMLString::equals(prefix,L"ID");
                if (bVar16) {
                  saveInfo._4_4_ = ID;
                }
                else {
                  bVar16 = XMLString::equals(prefix,(XMLCh *)XMLUni::fgIDRefString);
                  if (bVar16) {
                    saveInfo._4_4_ = IDRef;
                  }
                  else {
                    bVar16 = XMLString::equals(prefix,(XMLCh *)XMLUni::fgIDRefsString);
                    if (bVar16) {
                      saveInfo._4_4_ = IDRefs;
                    }
                    else {
                      bVar16 = XMLString::equals(prefix,(XMLCh *)XMLUni::fgEntityString);
                      if (bVar16) {
                        saveInfo._4_4_ = Entity;
                      }
                      else {
                        bVar16 = XMLString::equals(prefix,(XMLCh *)XMLUni::fgEntitiesString);
                        if (bVar16) {
                          saveInfo._4_4_ = Entities;
                        }
                        else {
                          bVar16 = XMLString::equals(prefix,(XMLCh *)XMLUni::fgNmTokenString);
                          if (bVar16) {
                            saveInfo._4_4_ = NmToken;
                          }
                          else {
                            bVar16 = XMLString::equals(prefix,(XMLCh *)XMLUni::fgNmTokensString);
                            if (bVar16) {
                              saveInfo._4_4_ = NmTokens;
                            }
                            else {
                              bVar16 = XMLString::equals(prefix,(XMLCh *)XMLUni::fgNotationString);
                              if (bVar16) {
                                saveInfo._4_4_ = Notation;
                              }
                              else {
                                saveInfo._4_4_ = Simple;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              pDStack_c8 = pDStack_f8;
              if (pDStack_f8 == (DatatypeValidator *)0x0) {
                reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x33,pXVar9,prefix,src,
                                  (XMLCh *)0x0);
              }
            }
          }
          else {
            if ((type != (XMLCh *)0x0) && (*type != L'\0')) {
              reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x32,src,(XMLCh *)0x0,
                                (XMLCh *)0x0,(XMLCh *)0x0);
            }
            pDStack_c8 = traverseSimpleTypeDecl(this,(DOMElement *)janAnnot.fData,false,0);
          }
          this->fSchemaInfo = pSVar1;
          bVar16 = false;
          valueToCheck._6_1_ = false;
          if ((attForm != (XMLCh *)0x0) && (*attForm != L'\0')) {
            bVar17 = XMLString::equals(attForm,(XMLCh *)SchemaSymbols::fgATTVAL_REQUIRED);
            if (bVar17) {
              bVar16 = true;
            }
            else {
              valueToCheck._6_1_ =
                   XMLString::equals(attForm,(XMLCh *)SchemaSymbols::fgATTVAL_PROHIBITED);
            }
          }
          local_2e0 = defaultVal_00;
          if (defaultVal_00 == (XMLCh *)0x0) {
            local_2e0 = useVal;
          }
          pXStack_108 = local_2e0;
          bVar17 = false;
          if (pDStack_c8 != (DatatypeValidator *)0x0) {
            VVar7 = DatatypeValidator::getType(pDStack_c8);
            bVar17 = VVar7 == ID;
          }
          if (((saveInfo._4_4_ == Simple) && (pDStack_c8 != (DatatypeValidator *)0x0)) &&
             (local_2e0 != (XMLCh *)0x0)) {
            sVar5 = DatatypeValidator::getWSFacet(pDStack_c8);
            if (((sVar5 == 1) && (bVar3 = XMLString::isWSReplaced(local_2e0), !bVar3)) ||
               ((sVar5 == 2 && (bVar3 = XMLString::isWSCollapsed(local_2e0), !bVar3)))) {
              tempURIName.fMemoryManager =
                   (MemoryManager *)XMLString::replicate(local_2e0,this->fMemoryManager);
              ArrayJanitor<char16_t>::ArrayJanitor
                        ((ArrayJanitor<char16_t> *)&anon_var_0,
                         (char16_t *)tempURIName.fMemoryManager,this->fMemoryManager);
              if (sVar5 == 1) {
                XMLString::replaceWS((XMLCh *)tempURIName.fMemoryManager,this->fMemoryManager);
              }
              else if (sVar5 == 2) {
                XMLString::collapseWS((XMLCh *)tempURIName.fMemoryManager,this->fMemoryManager);
              }
              pXVar2 = this->fStringPool;
              uVar8 = (*(pXVar2->super_XSerializable)._vptr_XSerializable[5])
                                (pXVar2,tempURIName.fMemoryManager);
              iVar6 = (*(pXVar2->super_XSerializable)._vptr_XSerializable[10])(pXVar2,(ulong)uVar8);
              pXStack_108 = (XMLCh *)CONCAT44(extraout_var_00,iVar6);
              ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)&anon_var_0);
            }
            pVVar14 = SchemaInfo::getValidationContext(this->fSchemaInfo);
            (*(pDStack_c8->super_XSerializable)._vptr_XSerializable[8])
                      (pDStack_c8,pXStack_108,pVVar14,this->fMemoryManager);
          }
          else if ((((saveInfo._4_4_ == NmTokens) || (saveInfo._4_4_ == IDRefs)) ||
                   (saveInfo._4_4_ == Entities)) &&
                  ((local_2e0 != (XMLCh *)0x0 &&
                   (bVar3 = XMLString::isWSCollapsed(local_2e0), !bVar3)))) {
            tempURIName_1.fMemoryManager =
                 (MemoryManager *)XMLString::replicate(local_2e0,this->fMemoryManager);
            ArrayJanitor<char16_t>::ArrayJanitor
                      ((ArrayJanitor<char16_t> *)&attDef,(char16_t *)tempURIName_1.fMemoryManager,
                       this->fMemoryManager);
            XMLString::collapseWS((XMLCh *)tempURIName_1.fMemoryManager,this->fMemoryManager);
            pXVar2 = this->fStringPool;
            uVar8 = (*(pXVar2->super_XSerializable)._vptr_XSerializable[5])
                              (pXVar2,tempURIName_1.fMemoryManager);
            iVar6 = (*(pXVar2->super_XSerializable)._vptr_XSerializable[10])(pXVar2,(ulong)uVar8);
            pXStack_108 = (XMLCh *)CONCAT44(extraout_var_01,iVar6);
            ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)&attDef);
          }
          if ((bVar17) && (pXStack_108 != (XMLCh *)0x0)) {
            reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x88,src,(XMLCh *)0x0,
                              (XMLCh *)0x0,(XMLCh *)0x0);
          }
          if (((nsMgr.fSchemaInfo._7_1_ & 1) == 0) && (bVar17)) {
            if (this->fCurrentAttGroupInfo == (XercesAttGroupInfo *)0x0) {
              bVar17 = ComplexTypeInfo::containsAttWithTypeId(typeInfo);
              if (!bVar17) {
                ComplexTypeInfo::setAttWithTypeId(typeInfo,true);
                goto LAB_0043663e;
              }
              reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x89,src,(XMLCh *)0x0,
                                (XMLCh *)0x0,(XMLCh *)0x0);
            }
            else {
              bVar17 = XercesAttGroupInfo::containsTypeWithId(this->fCurrentAttGroupInfo);
              if (!bVar17) {
                XercesAttGroupInfo::setTypeWithId(this->fCurrentAttGroupInfo,true);
                goto LAB_0043663e;
              }
              reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x8a,src,(XMLCh *)0x0,
                                (XMLCh *)0x0,(XMLCh *)0x0);
            }
          }
          else {
LAB_0043663e:
            pSVar13 = (SchemaAttDef *)XMemory::operator_new(0x68,this->fGrammarPoolMemoryManager);
            SchemaAttDef::SchemaAttDef
                      (pSVar13,L"",src,dv._4_4_,saveInfo._4_4_,Implied,
                       this->fGrammarPoolMemoryManager);
            SchemaAttDef::setDatatypeValidator(pSVar13,pDStack_c8);
            if (valueToCheck._6_1_ == false) {
              if (bVar16) {
                if (useVal == (XMLCh *)0x0) {
                  XMLAttDef::setDefaultType((XMLAttDef *)pSVar13,Required);
                }
                else {
                  XMLAttDef::setDefaultType((XMLAttDef *)pSVar13,Required_And_Fixed);
                }
              }
              else if (useVal == (XMLCh *)0x0) {
                if (defaultVal_00 != (XMLCh *)0x0) {
                  XMLAttDef::setDefaultType((XMLAttDef *)pSVar13,DefAttTypes_Min);
                }
              }
              else {
                XMLAttDef::setDefaultType((XMLAttDef *)pSVar13,Fixed);
              }
            }
            else {
              XMLAttDef::setDefaultType((XMLAttDef *)pSVar13,DefAttTypes_Max);
            }
            if (pXStack_108 != (XMLCh *)0x0) {
              XMLAttDef::setValue((XMLAttDef *)pSVar13,pXStack_108);
            }
            bVar16 = Janitor<xercesc_4_0::XSAnnotation>::isDataNull
                               ((Janitor<xercesc_4_0::XSAnnotation> *)&stack0xffffffffffffff60);
            if (!bVar16) {
              this_00 = this->fSchemaGrammar;
              pXVar15 = Janitor<xercesc_4_0::XSAnnotation>::release
                                  ((Janitor<xercesc_4_0::XSAnnotation> *)&stack0xffffffffffffff60);
              SchemaGrammar::putAnnotation(this_00,pSVar13,pXVar15);
            }
            if ((nsMgr.fSchemaInfo._7_1_ & 1) == 0) {
              if ((typeInfo != (ComplexTypeInfo *)0x0) &&
                 (ComplexTypeInfo::addAttDef(typeInfo,pSVar13),
                 this->fCurrentAttGroupInfo == (XercesAttGroupInfo *)0x0)) {
                SchemaAttDef::setPSVIScope(pSVar13,SCP_LOCAL);
              }
              if (this->fCurrentAttGroupInfo != (XercesAttGroupInfo *)0x0) {
                XercesAttGroupInfo::addAttDef
                          (this->fCurrentAttGroupInfo,pSVar13,typeInfo != (ComplexTypeInfo *)0x0);
              }
            }
            else {
              pXVar2 = this->fStringPool;
              this_01 = this->fAttributeDeclRegistry;
              uVar8 = (*(pXVar2->super_XSerializable)._vptr_XSerializable[5])(pXVar2,src);
              iVar6 = (*(pXVar2->super_XSerializable)._vptr_XSerializable[10])(pXVar2,(ulong)uVar8);
              RefHashTableOf<xercesc_4_0::XMLAttDef,_xercesc_4_0::StringHasher>::put
                        (this_01,(void *)CONCAT44(extraout_var_02,iVar6),(XMLAttDef *)pSVar13);
              SchemaAttDef::setPSVIScope(pSVar13,SCP_GLOBAL);
            }
          }
        }
        else {
          reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x31,src,(XMLCh *)0x0,
                            (XMLCh *)0x0,(XMLCh *)0x0);
        }
      }
      else {
        reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x31,src,(XMLCh *)0x0,
                          (XMLCh *)0x0,(XMLCh *)0x0);
      }
    }
  }
  else {
    if ((pXVar10 != (XMLCh *)0x0) ||
       ((type != (XMLCh *)0x0 || (janAnnot.fData != (XSAnnotation *)0x0)))) {
      local_220 = pXVar9;
      if (src != (XMLCh *)0x0) {
        local_220 = src;
      }
      reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x45,local_220,(XMLCh *)0x0,
                        (XMLCh *)0x0,(XMLCh *)0x0);
    }
    processAttributeDeclRef(this,elem,typeInfo,pXVar9,attForm,defaultVal_00,useVal);
  }
  Janitor<xercesc_4_0::XSAnnotation>::~Janitor
            ((Janitor<xercesc_4_0::XSAnnotation> *)&stack0xffffffffffffff60);
LAB_0043693a:
  NamespaceScopeManager::~NamespaceScopeManager((NamespaceScopeManager *)&name);
  return;
}

Assistant:

void TraverseSchema::traverseAttributeDecl(const DOMElement* const elem,
                                           ComplexTypeInfo* const typeInfo,
                                           const bool topLevel) {

    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    const XMLCh*   name = getElementAttValue(elem, SchemaSymbols::fgATT_NAME, DatatypeValidator::NCName);
    const XMLCh*   ref = getElementAttValue(elem, SchemaSymbols::fgATT_REF, DatatypeValidator::QName);
    bool           nameEmpty = (!name || !*name);
    bool           refEmpty = (!ref || !*ref);

    if (nameEmpty && refEmpty) {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::NoNameRefAttribute);
        return;
    }

    if (topLevel && nameEmpty) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::TopLevelNoNameAttribute);
        return;
    }

    // ------------------------------------------------------------------
    // Check attributes
    // ------------------------------------------------------------------
    unsigned short scope = (topLevel)
        ? GeneralAttributeCheck::E_AttributeGlobal
        : (refEmpty) ? GeneralAttributeCheck::E_AttributeLocal
                     : GeneralAttributeCheck::E_AttributeRef;

    fAttributeCheck.checkAttributes(elem, scope, this, topLevel, fNonXSAttList);

    const XMLCh* defaultVal = getElementAttValue(elem, SchemaSymbols::fgATT_DEFAULT);
    const XMLCh* fixedVal = getElementAttValue(elem, SchemaSymbols::fgATT_FIXED);
    const XMLCh* useVal = getElementAttValue(elem, SchemaSymbols::fgATT_USE);
    const XMLCh* attForm = getElementAttValue(elem, SchemaSymbols::fgATT_FORM);
    const XMLCh* dvType = getElementAttValue(elem, SchemaSymbols::fgATT_TYPE, DatatypeValidator::QName);
    DOMElement* simpleType = checkContent(elem, XUtil::getFirstChildElement(elem), true);
    Janitor<XSAnnotation> janAnnot(fAnnotation);
    bool         badContent = false;

    while (simpleType != 0) {

        const XMLCh* contentName = simpleType->getLocalName();

        if (XMLString::equals(SchemaSymbols::fgELT_SIMPLETYPE, contentName)) {

            if (XUtil::getNextSiblingElement(simpleType) != 0) {
                badContent = true;
            }
            break;
        }

        badContent = true;
        simpleType = XUtil::getNextSiblingElement(simpleType);
    }

    if (badContent) {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidAttributeContent,
                          (name) ? name : ref);
    }

    if (defaultVal) {

        if (fixedVal) {

            fixedVal = 0;
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AttributeDefaultFixedValue,
                              (name) ? name : ref);
        }

        if ((useVal && *useVal)
            && !XMLString::equals(useVal, SchemaSymbols::fgATTVAL_OPTIONAL)) {

            useVal = 0;
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::NotOptionalDefaultAttValue,
                              (name) ? name : ref);
        }
    }

    // processing ref
    if (!refEmpty && !topLevel) {

        // Check ref representation OK - 3.2.3::3.2
        if (attForm || dvType || (simpleType != 0)) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AttributeRefContentError,
                              (name) ? name : ref);
        }

        processAttributeDeclRef(elem, typeInfo, ref, useVal, defaultVal, fixedVal);
        return;
    }

    if (fScanner->getGenerateSyntheticAnnotations() && !fAnnotation && fNonXSAttList->size())
    {
        fAnnotation = generateSyntheticAnnotation(elem, fNonXSAttList);
        janAnnot.reset(fAnnotation);
    }

    // processing 'name'
    if (!XMLChar1_0::isValidNCName(name, XMLString::stringLen(name))
        || XMLString::equals(name, XMLUni::fgXMLNSString)) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidDeclarationName, SchemaSymbols::fgELT_ATTRIBUTE, name);
        return;
    }

    // Check for duplicate declaration
    const XMLCh* qualified = SchemaSymbols::fgATTVAL_QUALIFIED;
    int uriIndex = fEmptyNamespaceURI;

    if ((fTargetNSURIString && *fTargetNSURIString)
        && (topLevel || XMLString::equals(attForm, qualified)
            || ((fSchemaInfo->getElemAttrDefaultQualified() & Attr_Def_Qualified)
                && (!attForm || !*attForm)))) {
        uriIndex = fTargetNSURI;
    }

    // make sure that attribute namespace is not xsi uri
    if (XMLString::equals(fTargetNSURIString, SchemaSymbols::fgURI_XSI)) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidAttTNS, name);
        return;
    }

    if (typeInfo && typeInfo->getAttDef(name, uriIndex) != 0) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DuplicateAttribute, name);
        return;
    }
    else if (fCurrentAttGroupInfo && fCurrentAttGroupInfo->containsAttribute(name, uriIndex)) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DuplicateAttribute, name);
        return;
    }

    DatatypeValidator*  dv = 0;
    XMLAttDef::AttTypes attType = XMLAttDef::Simple;
    SchemaInfo* saveInfo = fSchemaInfo;

    if (simpleType != 0) {

        if (dvType && *dvType) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AttributeWithTypeAndSimpleType, name);
        }

        dv = traverseSimpleTypeDecl(simpleType, false);
    }
    else if (!dvType || !*dvType) {
        dv = fDatatypeRegistry->getDatatypeValidator(SchemaSymbols::fgDT_ANYSIMPLETYPE);
    }
    else {

        checkEnumerationRequiredNotation(elem, name, dvType);

        const XMLCh* localPart = getLocalPart(dvType);
        const XMLCh* prefix = getPrefix(dvType);
        const XMLCh* typeURI = resolvePrefixToURI(elem, prefix);
        DatatypeValidator*  dvBack = 0;

        if (XMLString::equals(typeURI, SchemaSymbols::fgURI_SCHEMAFORSCHEMA)) {
            dv = fDatatypeRegistry->getDatatypeValidator(localPart);
            dvBack = dv;
        }
        else { //isn't of the schema for schemas namespace...

            dv = getAttrDatatypeValidatorNS(elem, localPart, typeURI);
            dvBack = dv;

            while(dv != 0 && !XMLString::equals(dv->getTypeUri(), SchemaSymbols::fgURI_SCHEMAFORSCHEMA)) {
                dv = dv->getBaseValidator();
            }

            if(dv)
                localPart = dv->getTypeLocalName();
        }

        if(dv) {
            if (XMLString::equals(localPart,XMLUni::fgIDString)) {
                attType = XMLAttDef::ID;
            }
            else if (XMLString::equals(localPart,XMLUni::fgIDRefString)) {
                attType = XMLAttDef::IDRef;
            }
            else if (XMLString::equals(localPart,XMLUni::fgIDRefsString)) {
                attType = XMLAttDef::IDRefs;
            }
            else if (XMLString::equals(localPart,XMLUni::fgEntityString)) {
                attType = XMLAttDef::Entity;
            }
            else if (XMLString::equals(localPart,XMLUni::fgEntitiesString)) {
                attType = XMLAttDef::Entities;
            }
            else if (XMLString::equals(localPart,XMLUni::fgNmTokenString)) {
                attType = XMLAttDef::NmToken;
            }
            else if (XMLString::equals(localPart,XMLUni::fgNmTokensString)) {
                attType = XMLAttDef::NmTokens;
            }
            else if (XMLString::equals(localPart,XMLUni::fgNotationString)) {
                attType = XMLAttDef::Notation;
            }
            else {
                attType = XMLAttDef::Simple;
            }
        }
        else
            attType = XMLAttDef::Simple;

        dv = dvBack;

        if (!dv) {
            reportSchemaError
            (
                elem
                , XMLUni::fgXMLErrDomain
                , XMLErrs::AttributeSimpleTypeNotFound
                , typeURI
                , localPart
                , name
            );
        }
    }

    // restore schema information, if necessary
    fSchemaInfo = saveInfo;

    bool required = false;
    bool prohibited = false;

    if (useVal && *useVal) {

        if (XMLString::equals(useVal, SchemaSymbols::fgATTVAL_REQUIRED)) {
            required = true;
        }
        else if (XMLString::equals(useVal, SchemaSymbols::fgATTVAL_PROHIBITED)) {
            prohibited = true;
        }
    }

    // validate fixed/default values
    const XMLCh* valueToCheck = defaultVal ? defaultVal : fixedVal;
    bool  ofTypeID = (dv && dv->getType() == DatatypeValidator::ID);

    if (attType == XMLAttDef::Simple && dv && valueToCheck) {

        short wsFacet = dv->getWSFacet();
        if((wsFacet == DatatypeValidator::REPLACE && !XMLString::isWSReplaced(valueToCheck)) ||
           (wsFacet == DatatypeValidator::COLLAPSE && !XMLString::isWSCollapsed(valueToCheck)))
        {
            XMLCh* normalizedValue=XMLString::replicate(valueToCheck, fMemoryManager);
            ArrayJanitor<XMLCh> tempURIName(normalizedValue, fMemoryManager);
            if(wsFacet == DatatypeValidator::REPLACE)
                XMLString::replaceWS(normalizedValue, fMemoryManager);
            else if(wsFacet == DatatypeValidator::COLLAPSE)
                XMLString::collapseWS(normalizedValue, fMemoryManager);
            valueToCheck=fStringPool->getValueForId(fStringPool->addOrFind(normalizedValue));
        }
        try {
            dv->validate(valueToCheck
                      , fSchemaInfo->getValidationContext()
                      , fMemoryManager);
        }
        catch (const XMLException& excep) {
            reportSchemaError(elem, excep);
        }
        catch(const OutOfMemoryException&)
        {
            throw;
        }
        catch(...) {
            reportSchemaError(elem, XMLUni::fgValidityDomain, XMLValid::DatatypeValidationFailure, valueToCheck);
        }
    }
    else if((attType == XMLAttDef::NmTokens || attType==XMLAttDef::IDRefs || attType==XMLAttDef::Entities) &&
            valueToCheck && !XMLString::isWSCollapsed(valueToCheck))
    {
        XMLCh* normalizedValue=XMLString::replicate(valueToCheck, fMemoryManager);
        ArrayJanitor<XMLCh> tempURIName(normalizedValue, fMemoryManager);
        XMLString::collapseWS(normalizedValue, fMemoryManager);
        valueToCheck=fStringPool->getValueForId(fStringPool->addOrFind(normalizedValue));
    }

    if (ofTypeID && valueToCheck) {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AttDeclPropCorrect3, name);
    }

    // check for multiple attributes with type derived from ID
    if (!topLevel && ofTypeID) {

        if (fCurrentAttGroupInfo) {

            if (fCurrentAttGroupInfo->containsTypeWithId()) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AttGrpPropCorrect3, name);
                return;
            }

            fCurrentAttGroupInfo->setTypeWithId(true);
        }
        else {

            if (typeInfo->containsAttWithTypeId()) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AttDeclPropCorrect5, name);
                return;
            }

            typeInfo->setAttWithTypeId(true);
        }
    }

    // create SchemaAttDef
    SchemaAttDef* attDef = new (fGrammarPoolMemoryManager) SchemaAttDef
    (
        XMLUni::fgZeroLenString
        , name
        , uriIndex
        , attType
        , XMLAttDef::Implied
        , fGrammarPoolMemoryManager
    );

    attDef->setDatatypeValidator(dv);

    if (prohibited) {
        attDef->setDefaultType(XMLAttDef::Prohibited);
    }
    else if (required) {

        if (fixedVal) {
            attDef->setDefaultType(XMLAttDef::Required_And_Fixed);
        }
        else {
            attDef->setDefaultType(XMLAttDef::Required);
        }
    }
    else {

        if (fixedVal) {
            attDef->setDefaultType(XMLAttDef::Fixed);
        }
        else if (defaultVal) {
            attDef->setDefaultType(XMLAttDef::Default);
        }
    }

    if (valueToCheck) {
        attDef->setValue(valueToCheck);
    }

    if (!janAnnot.isDataNull())
        fSchemaGrammar->putAnnotation(attDef, janAnnot.release());

    if (topLevel)
    {
        fAttributeDeclRegistry->put((void*) fStringPool->getValueForId(fStringPool->addOrFind(name)), attDef);
        attDef->setPSVIScope(PSVIDefs::SCP_GLOBAL);
    }
    else
    {
        if (typeInfo)
        {
            typeInfo->addAttDef(attDef);
            if (!fCurrentAttGroupInfo)
                attDef->setPSVIScope(PSVIDefs::SCP_LOCAL);
        }

        if (fCurrentAttGroupInfo) {
            fCurrentAttGroupInfo->addAttDef(attDef, (typeInfo != 0));
        }
    }
}